

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void reset_frame_buffers(AV1_COMMON *cm)

{
  ulong uVar1;
  RefCntBuffer *pRVar2;
  
  pRVar2 = *(RefCntBuffer **)((long)cm->buffer_pool + 0x40);
  pthread_mutex_lock((pthread_mutex_t *)cm->buffer_pool);
  reset_ref_frame_map(cm);
  for (uVar1 = 0; uVar1 < cm->buffer_pool->num_frame_bufs; uVar1 = uVar1 + 1) {
    if ((pRVar2->ref_count < 1) || (pRVar2 == cm->cur_frame)) {
      pRVar2->ref_order_hints[3] = 0;
      pRVar2->ref_order_hints[4] = 0;
      pRVar2->ref_order_hints[5] = 0;
      pRVar2->ref_order_hints[6] = 0;
      pRVar2->order_hint = 0;
      pRVar2->ref_order_hints[0] = 0;
      pRVar2->ref_order_hints[1] = 0;
      pRVar2->ref_order_hints[2] = 0;
    }
    pRVar2 = pRVar2 + 1;
  }
  av1_zero_unused_internal_frame_buffers(&cm->buffer_pool->int_frame_buffers);
  pthread_mutex_unlock((pthread_mutex_t *)cm->buffer_pool);
  return;
}

Assistant:

static inline void reset_frame_buffers(AV1_COMMON *cm) {
  RefCntBuffer *const frame_bufs = cm->buffer_pool->frame_bufs;
  int i;

  lock_buffer_pool(cm->buffer_pool);
  reset_ref_frame_map(cm);
  assert(cm->cur_frame->ref_count == 1);
  for (i = 0; i < cm->buffer_pool->num_frame_bufs; ++i) {
    // Reset all unreferenced frame buffers. We can also reset cm->cur_frame
    // because we are the sole owner of cm->cur_frame.
    if (frame_bufs[i].ref_count > 0 && &frame_bufs[i] != cm->cur_frame) {
      continue;
    }
    frame_bufs[i].order_hint = 0;
    av1_zero(frame_bufs[i].ref_order_hints);
  }
  av1_zero_unused_internal_frame_buffers(&cm->buffer_pool->int_frame_buffers);
  unlock_buffer_pool(cm->buffer_pool);
}